

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_value * VmNewOperandStack(jx9_vm *pVm,sxu32 nInstr)

{
  undefined8 *puVar1;
  jx9_value *pjVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = nInstr + 0x10;
  pjVar2 = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator,uVar5 * 0x40);
  if (pjVar2 == (jx9_value *)0x0) {
    pjVar2 = (jx9_value *)0x0;
  }
  else if (uVar5 != 0) {
    lVar3 = (ulong)uVar5 << 6;
    lVar4 = (ulong)(nInstr + 0xf) << 6;
    do {
      puVar1 = (undefined8 *)((long)&(pjVar2->sBlob).nFlags + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pjVar2->sBlob).pBlob + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pjVar2->pVm + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pjVar2->x + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(jx9_vm **)((long)pjVar2 + lVar3 + -0x30) = pVm;
      puVar1 = (undefined8 *)((long)pjVar2 + lVar3 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(jx9_vm **)((long)pjVar2 + lVar3 + -0x28) = pVm;
      *(undefined4 *)((long)pjVar2 + lVar3 + -0x10) = 0;
      *(undefined4 *)((long)pjVar2 + lVar3 + -0x38) = 0x20;
      lVar4 = lVar4 + -0x40;
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != 0);
  }
  return pjVar2;
}

Assistant:

static jx9_value * VmNewOperandStack(
	jx9_vm *pVm, /* Target VM */
	sxu32 nInstr /* Total numer of generated bytecode instructions */
	)
{
	jx9_value *pStack;
  /* No instruction ever pushes more than a single element onto the
  ** stack and the stack never grows on successive executions of the
  ** same loop. So the total number of instructions is an upper bound
  ** on the maximum stack depth required.
  **
  ** Allocation all the stack space we will ever need.
  */
	nInstr += VM_STACK_GUARD;
	pStack = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator, nInstr * sizeof(jx9_value));
	if( pStack == 0 ){
		return 0;
	}
	/* Initialize the operand stack */
	while( nInstr > 0 ){
		jx9MemObjInit(&(*pVm), &pStack[nInstr - 1]);
		--nInstr;
	}
	/* Ready for bytecode execution */
	return pStack;
}